

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::remove_stale_weak_refs(CVmObjGramProd *this)

{
  int iVar1;
  vm_gram_ext *pvVar2;
  CVmObjTable *in_RDI;
  vm_obj_id_t in_stack_ffffffffffffffec;
  
  pvVar2 = get_ext((CVmObjGramProd *)in_RDI);
  if (pvVar2->comparator_ != 0) {
    get_ext((CVmObjGramProd *)in_RDI);
    iVar1 = CVmObjTable::is_obj_deletable(in_RDI,in_stack_ffffffffffffffec);
    if (iVar1 != 0) {
      pvVar2 = get_ext((CVmObjGramProd *)in_RDI);
      pvVar2->comparator_ = 0;
      pvVar2 = get_ext((CVmObjGramProd *)in_RDI);
      pvVar2->field_0x14 = pvVar2->field_0x14 & 0xfd;
    }
  }
  return;
}

Assistant:

void CVmObjGramProd::remove_stale_weak_refs(VMG0_)
{
    /* 
     *   Our reference to the dictionary comparator object is weak (we're
     *   only caching it - we don't want to prevent the object from being
     *   collected if no one else wants it).  So, forget it if the comparator
     *   is being deleted.  
     */
    if (get_ext()->comparator_ != VM_INVALID_OBJ
        && G_obj_table->is_obj_deletable(get_ext()->comparator_))
    {
        /* forget the comparator */
        get_ext()->comparator_ = VM_INVALID_OBJ;

        /* 
         *   our cached hash values depend on the comparator, so they're now
         *   invalid - forget about them 
         */
        get_ext()->hashes_cached_ = FALSE;
    }
}